

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::AssertControlTask::~AssertControlTask(AssertControlTask *this)

{
  SystemSubroutine::~SystemSubroutine((SystemSubroutine *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

explicit AssertControlTask(KnownSystemName knownNameId) :
        SystemTaskBase(knownNameId), isFullMethod(name == "$assertcontrol") {}